

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  ArrayPtr<const_unsigned_char> AVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  uint uVar4;
  size_t sVar5;
  uchar *puVar6;
  ulong uVar7;
  int iVar8;
  byte bVar9;
  byte *pbVar10;
  byte *pbVar11;
  uchar *puVar12;
  size_t sVar13;
  bool bVar14;
  ArrayPtr<const_unsigned_char> AVar15;
  ArrayPtr<const_unsigned_char> AVar16;
  ArrayPtr<const_unsigned_char> AVar17;
  size_t bytes_local;
  uint runLength;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  
  if (bytes != 0) {
    bytes_local = bytes;
    AVar15 = kj::BufferedInputStream::getReadBuffer(this->inner);
    AVar2.size_ = _kjCondition.left;
    AVar2.ptr = AVar15.ptr;
    do {
      _kjCondition.left = AVar2.size_;
      sVar13 = AVar15.size_;
      pbVar10 = AVar15.ptr;
      if ((ulong)((long)(AVar2.ptr + sVar13) - (long)pbVar10) < 10) {
        if (AVar2.ptr + sVar13 == pbVar10) {
          (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar13);
          AVar15 = kj::BufferedInputStream::getReadBuffer(this->inner);
          _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
          _kjCondition.op.content.ptr = " > ";
          _kjCondition.op.content.size_ = 4;
          bVar14 = AVar15.size_ == 0;
          _kjCondition.result = !bVar14;
          if (bVar14) {
            iVar8 = 0xd0;
LAB_0024d6d7:
            _kjCondition.left = 0;
            _kjCondition.op.content.size_ = 4;
            _kjCondition.op.content.ptr = " > ";
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,iVar8,FAILED,"buffer.size() > 0",
                       "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                       (char (*) [31])"Premature end of packed input.");
LAB_0024d6fa:
            puVar6 = AVar15.ptr;
            AVar17.size_ = AVar15.size_;
            AVar17.ptr = pbVar10;
            kj::_::Debug::Fault::~Fault(&f);
            goto LAB_0024d72d;
          }
          iVar8 = 5;
          AVar2 = AVar15;
        }
        else {
          bVar9 = *pbVar10;
          pbVar10 = pbVar10 + 1;
          bVar14 = false;
          uVar4 = 0;
          do {
            _kjCondition.left = AVar2.size_;
            AVar16.size_ = sVar13;
            AVar16.ptr = pbVar10;
            if ((bVar9 >> (uVar4 & 0x1f) & 1) != 0) {
              if (AVar2.ptr + sVar13 == pbVar10) {
                (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar13);
                AVar16 = kj::BufferedInputStream::getReadBuffer(this->inner);
                _kjCondition.left = AVar16.size_;
                _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
                _kjCondition.op.content.ptr = " > ";
                _kjCondition.op.content.size_ = 4;
                _kjCondition.result = _kjCondition.left != 0;
                AVar2 = AVar16;
                if (_kjCondition.left == 0) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                            (&f,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                             ,0xdc,FAILED,"buffer.size() > 0",
                             "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                             (char (*) [31])"Premature end of packed input.");
                  kj::_::Debug::Fault::~Fault(&f);
                  iVar8 = 1;
                  goto LAB_0024d39e;
                }
              }
              sVar13 = AVar16.size_;
              pbVar10 = AVar16.ptr + 1;
            }
            _kjCondition.left = AVar2.size_;
            AVar16.size_ = sVar13;
            AVar16.ptr = AVar2.ptr;
            bVar14 = 6 < uVar4;
            uVar4 = uVar4 + 1;
          } while (uVar4 != 8);
          iVar8 = 9;
LAB_0024d39e:
          sVar13 = AVar16.size_;
          puVar6 = AVar16.ptr;
          AVar2.size_ = _kjCondition.left;
          AVar2.ptr = puVar6;
          AVar3.size_ = _kjCondition.left;
          AVar3.ptr = puVar6;
          AVar15.size_ = sVar13;
          AVar15.ptr = pbVar10;
          AVar17.size_ = sVar13;
          AVar17.ptr = pbVar10;
          if (bVar14) {
            bytes_local = bytes_local - 8;
            if ((puVar6 + sVar13 == pbVar10) &&
               (AVar17 = AVar15, AVar3 = AVar2, (byte)(bVar9 + 1) < 2)) {
              (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar13);
              AVar17 = kj::BufferedInputStream::getReadBuffer(this->inner);
              _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
              _kjCondition.op.content.ptr = " > ";
              _kjCondition.op.content.size_ = 4;
              bVar14 = AVar17.size_ == 0;
              _kjCondition.result = !bVar14;
              AVar3 = AVar17;
              if (bVar14) {
                iVar8 = 0xe4;
                AVar15 = AVar17;
                goto LAB_0024d6d7;
              }
            }
            goto LAB_0024d46a;
          }
        }
      }
      else {
        bVar9 = *pbVar10;
        AVar17.size_ = sVar13;
        AVar17.ptr = pbVar10 + (ulong)(bVar9 >> 7) +
                               (ulong)((bVar9 >> 6 & 1) != 0) +
                               (ulong)(bVar9 >> 5 & 1) +
                               (ulong)((bVar9 >> 4 & 1) != 0) +
                               (ulong)(bVar9 >> 3 & 1) +
                               (ulong)((bVar9 >> 2 & 1) != 0) +
                               (ulong)(bVar9 >> 1 & 1) + (ulong)(bVar9 & 1) + 1;
        bytes_local = bytes_local - 8;
        AVar3 = AVar2;
LAB_0024d46a:
        puVar6 = AVar3.ptr;
        sVar13 = AVar17.size_;
        AVar15.size_ = sVar13;
        AVar15.ptr = puVar6;
        pbVar11 = AVar17.ptr;
        if (bVar9 == 0xff) {
          pbVar10 = pbVar11 + 1;
          AVar17.size_ = sVar13;
          AVar17.ptr = pbVar10;
          AVar1.size_ = sVar13;
          AVar1.ptr = pbVar10;
          puVar12 = (uchar *)((ulong)*pbVar11 * 8);
          runLength = (uint)puVar12;
          _kjCondition.left = (unsigned_long)&runLength;
          _kjCondition._8_8_ = &bytes_local;
          _kjCondition.op.content.ptr = " <= ";
          _kjCondition.op.content.size_ = 5;
          sVar5 = bytes_local + (ulong)*pbVar11 * -8;
          _kjCondition.result = bytes_local >= puVar12;
          if (bytes_local < puVar12) {
            bVar14 = false;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long&>&,char_const(&)[56]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x109,FAILED,"runLength <= bytes",
                       "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                       (DebugComparison<unsigned_int_&,_unsigned_long_&> *)&_kjCondition,
                       (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
            kj::_::Debug::Fault::~Fault(&f);
            iVar8 = 1;
          }
          else {
            bytes_local = sVar5;
            if (puVar12 < puVar6 + (sVar13 - (long)pbVar10)) {
              AVar17.ptr = pbVar10 + (long)puVar12;
              iVar8 = 0;
              bVar14 = true;
            }
            else {
              runLength = runLength - (int)(puVar6 + (sVar13 - (long)pbVar10));
              (*(this->inner->super_InputStream)._vptr_InputStream[3])
                        (this->inner,runLength + sVar13);
              if (bytes_local == 0) {
                iVar8 = 1;
                bVar14 = false;
                AVar17 = AVar1;
              }
              else {
                AVar17 = kj::BufferedInputStream::getReadBuffer(this->inner);
                puVar6 = AVar17.ptr;
                iVar8 = 5;
                bVar14 = false;
              }
            }
          }
          AVar3.size_ = _kjCondition.left;
          AVar3.ptr = puVar6;
          AVar15 = AVar17;
          sVar5 = bytes_local;
          AVar2 = AVar3;
          if (!bVar14) goto LAB_0024d732;
        }
        else {
          sVar5 = bytes_local;
          if (bVar9 == 0) {
            pbVar10 = pbVar11 + 1;
            AVar17.size_ = sVar13;
            AVar17.ptr = pbVar10;
            uVar7 = (ulong)*pbVar11 * 8;
            runLength = (uint)uVar7;
            _kjCondition.left = (unsigned_long)&runLength;
            AVar3.size_ = _kjCondition.left;
            AVar3.ptr = puVar6;
            _kjCondition._8_8_ = &bytes_local;
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = bytes_local >= uVar7;
            sVar5 = bytes_local + (ulong)*pbVar11 * -8;
            if (bytes_local < uVar7) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long&>&,char_const(&)[56]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0xfe,FAILED,"runLength <= bytes",
                         "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                         (DebugComparison<unsigned_int_&,_unsigned_long_&> *)&_kjCondition,
                         (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
              goto LAB_0024d6fa;
            }
          }
        }
        bytes_local = sVar5;
        _kjCondition.left = AVar3.size_;
        puVar6 = AVar3.ptr;
        iVar8 = 0;
        AVar15 = AVar17;
        AVar2 = AVar3;
        if (bytes_local == 0) {
          (*(this->inner->super_InputStream)._vptr_InputStream[3])
                    (this->inner,(long)AVar17.ptr - (long)puVar6);
LAB_0024d72d:
          AVar2.size_ = _kjCondition.left;
          AVar2.ptr = puVar6;
          iVar8 = 1;
          AVar15 = AVar17;
        }
      }
LAB_0024d732:
    } while ((iVar8 == 0) || (iVar8 == 5));
  }
  return;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}